

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

char * __thiscall
Imf_3_3::anon_unknown_75::MemAttrStream::readMemoryMapped(MemAttrStream *this,int n)

{
  long lVar1;
  undefined8 uVar2;
  InputExc *this_00;
  int in_ESI;
  long in_RDI;
  char *retVal;
  char *in_stack_ffffffffffffffb8;
  InputExc *in_stack_ffffffffffffffc0;
  
  if (*(ulong *)(in_RDI + 0x30) <= *(ulong *)(in_RDI + 0x38)) {
    uVar2 = __cxa_allocate_exception(0x48);
    Iex_3_3::InputExc::InputExc(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __cxa_throw(uVar2,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
  }
  if (*(ulong *)(in_RDI + 0x30) < (ulong)(*(long *)(in_RDI + 0x38) + (long)in_ESI)) {
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_3::InputExc::InputExc(this_00,in_stack_ffffffffffffffb8);
    __cxa_throw(this_00,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
  }
  lVar1 = *(long *)(in_RDI + 0x38);
  *(long *)(in_RDI + 0x38) = (long)in_ESI + *(long *)(in_RDI + 0x38);
  return (char *)(*(long *)(in_RDI + 0x28) + lVar1);
}

Assistant:

char*    readMemoryMapped (int n) override
    {
        if (_pos >= _sz)
            throw IEX_NAMESPACE::InputExc ("Unexpected end of file.");

        if (_pos + n > _sz)
            throw IEX_NAMESPACE::InputExc ("Reading past end of file.");

        char* retVal = _data + _pos;
        _pos += n;
        return retVal;
    }